

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Part.cpp
# Opt level: O1

void __thiscall MT32Emu::PolyList::append(PolyList *this,Poly *poly)

{
  Poly::setNext(poly,(Poly *)0x0);
  if (this->lastPoly != (Poly *)0x0) {
    Poly::setNext(this->lastPoly,poly);
  }
  this->lastPoly = poly;
  if (this->firstPoly == (Poly *)0x0) {
    this->firstPoly = poly;
  }
  return;
}

Assistant:

void PolyList::append(Poly *poly) {
#ifdef MT32EMU_POLY_LIST_DEBUG
	if (poly->getNext() != NULL) {
		printf("PolyList: Non-NULL next field in a Poly being appended is ignored\n");
	}
#endif
	poly->setNext(NULL);
	if (lastPoly != NULL) {
#ifdef MT32EMU_POLY_LIST_DEBUG
		if (lastPoly->getNext() != NULL) {
			printf("PolyList: Non-NULL next field in the lastPoly\n");
		}
#endif
		lastPoly->setNext(poly);
	}
	lastPoly = poly;
	if (firstPoly == NULL) {
		firstPoly = poly;
	}
}